

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

string * __thiscall
flatbuffers::rust::RustGenerator::GetTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  FullType FVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  Type local_40;
  
  FVar1 = anon_unknown_26::GetFullType(type);
  if (FVar1 < (ftVectorOfUnionValue|ftTable)) {
    if ((0x67U >> (FVar1 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) != 0) {
      GetTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type);
      return __return_storage_ptr__;
    }
    if ((0xe0000U >> (FVar1 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) == 0) {
      if (FVar1 != ftTable) goto LAB_001ffd47;
      WrapInNameSpace(&local_e0,this,(type->struct_def->super_Definition).defined_namespace,
                      (string *)type->struct_def);
      std::operator+(__return_storage_ptr__,&local_e0,"<\'a>");
      this_00 = &local_e0;
    }
    else {
      local_40.base_type = type->element;
      local_40.fixed_length = type->fixed_length;
      local_40.element = BASE_TYPE_NONE;
      local_40.struct_def = type->struct_def;
      local_40.enum_def = type->enum_def;
      GetTypeGet_abi_cxx11_(&local_60,this,&local_40);
      std::operator+(&local_a0,"[",&local_60);
      std::operator+(&local_80,&local_a0,"; ");
      NumToString<unsigned_short>(&local_c0,type->fixed_length);
      std::operator+(&local_e0,&local_80,&local_c0);
      std::operator+(__return_storage_ptr__,&local_e0,"]");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      this_00 = &local_60;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
LAB_001ffd47:
    WrapInNameSpace(__return_storage_ptr__,this,
                    (type->struct_def->super_Definition).defined_namespace,
                    (string *)type->struct_def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeGet(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey: {
        return GetTypeBasic(type);
      }
      case ftArrayOfBuiltin:
      case ftArrayOfEnum:
      case ftArrayOfStruct: {
        return "[" + GetTypeGet(type.VectorType()) + "; " +
               NumToString(type.fixed_length) + "]";
      }
      case ftTable: {
        return WrapInNameSpace(type.struct_def->defined_namespace,
                               type.struct_def->name) +
               "<'a>";
      }
      default: {
        return WrapInNameSpace(type.struct_def->defined_namespace,
                               type.struct_def->name);
      }
    }
  }